

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_tables(archive_read *a,rar5 *rar,uint8_t *p)

{
  byte bVar1;
  int iVar2;
  wchar_t wVar3;
  ushort uVar4;
  bool bVar5;
  ushort local_216;
  ushort local_214;
  ushort local_212;
  int iStack_210;
  uint16_t n_1;
  uint16_t n;
  uint16_t num;
  wchar_t k;
  uint8_t nibble_shift;
  uint8_t nibble_mask;
  uint8_t table [430];
  uint8_t bit_length [20];
  int local_38;
  wchar_t idx;
  wchar_t w;
  wchar_t i;
  wchar_t value;
  wchar_t ret;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  num._1_1_ = 0xf0;
  num._0_1_ = 4;
  local_38 = 0;
  idx = L'\0';
  while (local_38 < 0x14) {
    if ((rar->cstate).cur_block_size <= (long)idx) {
      archive_set_error(&a->archive,0x54,"Truncated data in huffman tables");
      return L'\xffffffe2';
    }
    iVar2 = (int)(uint)(p[idx] & num._1_1_) >> (byte)num;
    if (num._1_1_ == 0xf) {
      idx = idx + L'\x01';
    }
    bVar1 = num._1_1_ ^ 0xff;
    if (iVar2 == 0xf) {
      iVar2 = (int)(uint)(p[idx] & bVar1) >> ((byte)num ^ 4);
      if (bVar1 == 0xf) {
        idx = idx + L'\x01';
      }
      if (iVar2 == 0) {
        table[(long)local_38 + 0x1a8] = '\x0f';
        local_38 = local_38 + 1;
      }
      else {
        for (iStack_210 = 0; iStack_210 < iVar2 + 2 && local_38 < 0x14; iStack_210 = iStack_210 + 1)
        {
          table[(long)local_38 + 0x1a8] = '\0';
          local_38 = local_38 + 1;
        }
      }
    }
    else {
      table[(long)local_38 + 0x1a8] = (uint8_t)iVar2;
      num._0_1_ = (byte)num ^ 4;
      num._1_1_ = bVar1;
      local_38 = local_38 + 1;
    }
  }
  (rar->bits).in_addr = idx;
  (rar->bits).bit_addr = (byte)num ^ 4;
  wVar3 = create_decode_tables(table + 0x1a8,&(rar->cstate).bd,L'\x14');
  if (wVar3 == L'\0') {
    idx = L'\0';
    while (idx < L'Ʈ') {
      wVar3 = decode_number(a,&(rar->cstate).bd,p,&local_212);
      if (wVar3 != L'\0') {
        archive_set_error(&a->archive,0x54,"Decoding huffman tables failed");
        return L'\xffffffe2';
      }
      if (local_212 < 0x10) {
        *(char *)((long)&k + (long)idx) = (char)local_212;
        idx = idx + L'\x01';
      }
      else if (local_212 < 0x12) {
        wVar3 = read_bits_16(a,rar,p,&local_214);
        if (wVar3 != L'\0') {
          return wVar3;
        }
        if (local_212 == 0x10) {
          local_214 = (short)((int)(uint)local_214 >> 0xd) + 3;
          skip_bits(rar,L'\x03');
        }
        else {
          local_214 = (short)((int)(uint)local_214 >> 9) + 0xb;
          skip_bits(rar,L'\a');
        }
        if (idx < L'\x01') {
          archive_set_error(&a->archive,0x54,"Unexpected error when decoding huffman tables");
          return L'\xffffffe2';
        }
        for (; uVar4 = local_214 - 1, bVar5 = local_214 != 0, local_214 = uVar4,
            bVar5 && idx < L'Ʈ'; idx = idx + L'\x01') {
          *(undefined1 *)((long)&k + (long)idx) =
               *(undefined1 *)((long)&k + (long)(idx + L'\xffffffff'));
        }
      }
      else {
        wVar3 = read_bits_16(a,rar,p,&local_216);
        if (wVar3 != L'\0') {
          return wVar3;
        }
        if (local_212 == 0x12) {
          local_216 = (short)((int)(uint)local_216 >> 0xd) + 3;
          skip_bits(rar,L'\x03');
        }
        else {
          local_216 = (short)((int)(uint)local_216 >> 9) + 0xb;
          skip_bits(rar,L'\a');
        }
        while (uVar4 = local_216 - 1, bVar5 = local_216 != 0, local_216 = uVar4,
              bVar5 && idx < L'Ʈ') {
          *(undefined1 *)((long)&k + (long)idx) = 0;
          idx = idx + L'\x01';
        }
      }
    }
    wVar3 = create_decode_tables((uint8_t *)&k,&(rar->cstate).ld,L'Ĳ');
    if (wVar3 == L'\0') {
      wVar3 = create_decode_tables(table + 0x12a,&(rar->cstate).dd,L'@');
      if (wVar3 == L'\0') {
        wVar3 = create_decode_tables(table + 0x16a,&(rar->cstate).ldd,L'\x10');
        if (wVar3 == L'\0') {
          wVar3 = create_decode_tables(table + 0x17a,&(rar->cstate).rd,L',');
          if (wVar3 == L'\0') {
            a_local._4_4_ = L'\0';
          }
          else {
            archive_set_error(&a->archive,0x54,"Failed to create repeating distances table");
            a_local._4_4_ = L'\xffffffe2';
          }
        }
        else {
          archive_set_error(&a->archive,0x54,"Failed to create lower bits of distances table");
          a_local._4_4_ = L'\xffffffe2';
        }
      }
      else {
        archive_set_error(&a->archive,0x54,"Failed to create distance table");
        a_local._4_4_ = L'\xffffffe2';
      }
    }
    else {
      archive_set_error(&a->archive,0x54,"Failed to create literal table");
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  else {
    archive_set_error(&a->archive,0x54,"Decoding huffman tables failed");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int parse_tables(struct archive_read* a, struct rar5* rar,
    const uint8_t* p)
{
	int ret, value, i, w, idx = 0;
	uint8_t bit_length[HUFF_BC],
		table[HUFF_TABLE_SIZE],
		nibble_mask = 0xF0,
		nibble_shift = 4;

	enum { ESCAPE = 15 };

	/* The data for table generation is compressed using a simple RLE-like
	 * algorithm when storing zeroes, so we need to unpack it first. */
	for(w = 0, i = 0; w < HUFF_BC;) {
		if(i >= rar->cstate.cur_block_size) {
			/* Truncated data, can't continue. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated data in huffman tables");
			return ARCHIVE_FATAL;
		}

		value = (p[i] & nibble_mask) >> nibble_shift;

		if(nibble_mask == 0x0F)
			++i;

		nibble_mask ^= 0xFF;
		nibble_shift ^= 4;

		/* Values smaller than 15 is data, so we write it directly.
		 * Value 15 is a flag telling us that we need to unpack more
		 * bytes. */
		if(value == ESCAPE) {
			value = (p[i] & nibble_mask) >> nibble_shift;
			if(nibble_mask == 0x0F)
				++i;
			nibble_mask ^= 0xFF;
			nibble_shift ^= 4;

			if(value == 0) {
				/* We sometimes need to write the actual value
				 * of 15, so this case handles that. */
				bit_length[w++] = ESCAPE;
			} else {
				int k;

				/* Fill zeroes. */
				for(k = 0; (k < value + 2) && (w < HUFF_BC);
				    k++) {
					bit_length[w++] = 0;
				}
			}
		} else {
			bit_length[w++] = value;
		}
	}

	rar->bits.in_addr = i;
	rar->bits.bit_addr = nibble_shift ^ 4;

	ret = create_decode_tables(bit_length, &rar->cstate.bd, HUFF_BC);
	if(ret != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Decoding huffman tables failed");
		return ARCHIVE_FATAL;
	}

	for(i = 0; i < HUFF_TABLE_SIZE;) {
		uint16_t num;

		ret = decode_number(a, &rar->cstate.bd, p, &num);
		if(ret != ARCHIVE_OK) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Decoding huffman tables failed");
			return ARCHIVE_FATAL;
		}

		if(num < 16) {
			/* 0..15: store directly */
			table[i] = (uint8_t) num;
			i++;
		} else if(num < 18) {
			/* 16..17: repeat previous code */
			uint16_t n;

			if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &n)))
				return ret;

			if(num == 16) {
				n >>= 13;
				n += 3;
				skip_bits(rar, 3);
			} else {
				n >>= 9;
				n += 11;
				skip_bits(rar, 7);
			}

			if(i > 0) {
				while(n-- > 0 && i < HUFF_TABLE_SIZE) {
					table[i] = table[i - 1];
					i++;
				}
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Unexpected error when decoding "
				    "huffman tables");
				return ARCHIVE_FATAL;
			}
		} else {
			/* other codes: fill with zeroes `n` times */
			uint16_t n;

			if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &n)))
				return ret;

			if(num == 18) {
				n >>= 13;
				n += 3;
				skip_bits(rar, 3);
			} else {
				n >>= 9;
				n += 11;
				skip_bits(rar, 7);
			}

			while(n-- > 0 && i < HUFF_TABLE_SIZE)
				table[i++] = 0;
		}
	}

	ret = create_decode_tables(&table[idx], &rar->cstate.ld, HUFF_NC);
	if(ret != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		     "Failed to create literal table");
		return ARCHIVE_FATAL;
	}

	idx += HUFF_NC;

	ret = create_decode_tables(&table[idx], &rar->cstate.dd, HUFF_DC);
	if(ret != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Failed to create distance table");
		return ARCHIVE_FATAL;
	}

	idx += HUFF_DC;

	ret = create_decode_tables(&table[idx], &rar->cstate.ldd, HUFF_LDC);
	if(ret != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Failed to create lower bits of distances table");
		return ARCHIVE_FATAL;
	}

	idx += HUFF_LDC;

	ret = create_decode_tables(&table[idx], &rar->cstate.rd, HUFF_RC);
	if(ret != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Failed to create repeating distances table");
		return ARCHIVE_FATAL;
	}

	return ARCHIVE_OK;
}